

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
apply_permutation<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *p)

{
  value_type vVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  allocator_type *in_RDI;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sorted_vec;
  allocator_type *this_00;
  undefined4 local_30;
  
  this_00 = in_RDI;
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xb03843);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this,(size_type)this_00,in_RDI);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xb03863);
  for (local_30 = 0;
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX),
      (ulong)(long)local_30 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDX,(long)local_30);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,*pvVar3);
    vVar1 = *pvVar4;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                        (long)local_30);
    *pvVar5 = vVar1;
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

std::vector<T> apply_permutation(
    const std::vector<T>& vec,
    const std::vector<std::size_t>& p)
{
    std::vector<T> sorted_vec(p.size());
    for (int i=0;i<p.size();i++)
        sorted_vec[i]=vec[p[i]];
    return sorted_vec;
}